

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O2

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::compute<true>(SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                *this,MatrixType *matrix)

{
  ConstCholMatrixPtr pmat;
  CholMatrixType tmp;
  
  SparseMatrix<double,_0,_int>::SparseMatrix(&tmp,matrix->m_outerSize,matrix->m_outerSize);
  ordering(this,matrix,&pmat,&tmp);
  analyzePattern_preordered(this,pmat,true);
  factorize_preordered<true>(this,pmat);
  SparseMatrix<double,_0,_int>::~SparseMatrix(&tmp);
  return;
}

Assistant:

void compute(const MatrixType& matrix)
    {
      eigen_assert(matrix.rows()==matrix.cols());
      Index size = matrix.cols();
      CholMatrixType tmp(size,size);
      ConstCholMatrixPtr pmat;
      ordering(matrix, pmat, tmp);
      analyzePattern_preordered(*pmat, DoLDLT);
      factorize_preordered<DoLDLT>(*pmat);
    }